

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseRows(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  iterator iVar1;
  uint3 uVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  iterator iVar7;
  iterator __position;
  HMpsFF *this_00;
  Parsekey unaff_R13D;
  double dVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar9;
  bool skip;
  string rowname;
  size_t start;
  string name;
  size_t end;
  string strline;
  string word;
  bool local_111;
  undefined4 local_110;
  Parsekey local_10c;
  undefined1 local_108 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e8;
  vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
  *local_e0;
  vector<double,std::allocator<double>> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  ulong local_c8;
  size_t local_c0;
  string local_b8;
  string *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  string *local_88;
  HighsLogOptions *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = (HMpsFF *)&this->objective_name;
  local_88 = (string *)this_00;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)(this->objective_name)._M_string_length,0x3bf9b9);
  local_d0 = &this->row_lower;
  local_d8 = (vector<double,std::allocator<double>> *)&this->row_upper;
  local_e0 = &this->row_type;
  local_e8 = &(this->rowname2idx)._M_h;
  local_90 = &this->row_names;
  local_98 = (string *)&this->duplicate_row_name_;
  local_c8 = 0;
  while (bVar3 = getMpsLine(this_00,file,&local_70,&local_111), bVar3) {
    if (local_111 == false) {
      if ((0.0 < this->time_limit_) &&
         (lVar5 = std::chrono::_V2::system_clock::now(),
         dVar8 = (double)lVar5 / 1000000000.0 - this->start_time,
         this->time_limit_ <= dVar8 && dVar8 != this->time_limit_)) {
        unaff_R13D = kTimeout;
        goto LAB_001f4707;
      }
      local_c0 = 0;
      local_78 = (pointer)0x0;
      local_10c = unaff_R13D;
      unaff_R13D = checkFirstWord(this,&local_70,&local_c0,(size_t *)&local_78,&local_50);
      sVar6 = local_c0;
      if (unaff_R13D != kNone) {
        highsLogDev(log_options,kInfo,"readMPS: Read ROWS    OK\n");
        if ((local_c8 & 1) == 0) {
          this->warning_issued_ = true;
          highsLogUser(log_options,kWarning,"No objective row found\n");
          local_108._0_4_ = 0xffffffff;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<char_const(&)[27],int>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_e8,"artificial_empty_objective");
        }
        goto LAB_001f4707;
      }
      local_80 = log_options;
      switch(local_70._M_dataplus._M_p[local_c0]) {
      case 'E':
        local_108._0_8_ = (pointer)0x0;
        iVar1._M_current =
             (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_d0,iVar1,(double *)local_108);
        }
        else {
          *iVar1._M_current = 0.0;
          (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_108._0_8_ = (pointer)0x0;
        iVar1._M_current =
             (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_d8,iVar1,(double *)local_108);
        }
        else {
          *iVar1._M_current = 0.0;
          (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_108._0_4_ = 1;
        __position._M_current =
             (this->row_type).
             super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->row_type).
            super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
          ::_M_realloc_insert<free_format_parser::HMpsFF::Boundtype>
                    (local_e0,__position,(Boundtype *)local_108);
        }
        else {
          *__position._M_current = kEq;
LAB_001f44d4:
          (this->row_type).
          super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        break;
      default:
        std::__cxx11::string::substr((ulong)local_108,(ulong)&local_70);
        trim((string *)local_108,&default_non_chars_abi_cxx11_);
        highsLogUser(log_options,kError,"Entry \"%s\" in ROWS section of MPS file is unidentified\n"
                     ,local_108._0_8_);
        if ((HMpsFF *)local_108._0_8_ != (HMpsFF *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
        goto LAB_001f4701;
      case 'G':
        local_108._0_8_ = (pointer)0x0;
        iVar1._M_current =
             (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_d0,iVar1,(double *)local_108);
        }
        else {
          *iVar1._M_current = 0.0;
          (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_d8,iVar1,(double *)&kHighsInf);
        }
        else {
          *iVar1._M_current = INFINITY;
          (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_108._0_4_ = 2;
        __position._M_current =
             (this->row_type).
             super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->row_type).
            super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = kGe;
          goto LAB_001f44d4;
        }
        std::
        vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
        ::_M_realloc_insert<free_format_parser::HMpsFF::Boundtype>
                  (local_e0,__position,(Boundtype *)local_108);
        break;
      case 'L':
        local_108._0_8_ = &DAT_fff0000000000000;
        iVar1._M_current =
             (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_d0,iVar1,(double *)local_108);
        }
        else {
          *iVar1._M_current = -INFINITY;
          (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_108._0_8_ = (pointer)0x0;
        iVar1._M_current =
             (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_d8,iVar1,(double *)local_108);
        }
        else {
          *iVar1._M_current = 0.0;
          (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
        __position._M_current =
             (this->row_type).
             super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->row_type).
            super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = kLe;
          goto LAB_001f44d4;
        }
        std::
        vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
        ::_M_realloc_insert<free_format_parser::HMpsFF::Boundtype>
                  (local_e0,__position,(Boundtype *)local_108);
        break;
      case 'N':
        if ((local_c8 & 1) != 0) {
          bVar3 = true;
          goto LAB_001f44e1;
        }
        this->cost_row_location = this->num_row;
        uVar2 = (uint3)((uint)this->num_row >> 8);
        local_110 = (undefined4)CONCAT71((uint7)uVar2,1);
        bVar3 = false;
        local_c8 = (ulong)CONCAT31(uVar2,1);
        goto LAB_001f44e9;
      }
      bVar3 = false;
LAB_001f44e1:
      local_110 = 0;
LAB_001f44e9:
      first_word((string *)local_108,&local_70,sVar6 + 1);
      sVar6 = first_word_end(&local_70,sVar6 + 1);
      bVar4 = is_end(&local_70,sVar6,&default_non_chars_abi_cxx11_);
      if (bVar4) {
        if (bVar3) {
          local_b8._M_dataplus._M_p._0_4_ = -2;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,int>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_e8,local_108,&local_b8);
          bVar3 = false;
          unaff_R13D = local_10c;
        }
        else {
          local_b8._M_dataplus._M_p._0_4_ = -1;
          if ((char)local_110 == '\0') {
            local_b8._M_dataplus._M_p._0_4_ = this->num_row;
            this->num_row = (int)local_b8._M_dataplus._M_p + 1;
          }
          pVar9 = std::
                  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  ::_M_emplace<std::__cxx11::string&,int>
                            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              *)local_e8,(value_type *)local_108,&local_b8);
          if ((char)local_110 == '\0') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_90,(value_type *)local_108);
          }
          else {
            std::__cxx11::string::_M_assign(local_88);
          }
          bVar3 = false;
          unaff_R13D = local_10c;
          if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (this->has_duplicate_row_name_ == false)) {
            this->has_duplicate_row_name_ = true;
            iVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_e8,(key_type *)local_108);
            std::__cxx11::string::_M_assign(local_98);
            this->duplicate_row_name_index0_ =
                 *(HighsInt *)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                         ._M_cur + 0x28);
            this->duplicate_row_name_index1_ = this->num_row + -1;
            unaff_R13D = local_10c;
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_70);
        trim(&local_b8,&default_non_chars_abi_cxx11_);
        std::__cxx11::string::_M_assign((string *)&local_b8);
        bVar3 = local_b8._M_string_length < 9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p) !=
            &local_b8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p));
        }
        unaff_R13D = (uint)bVar3 * 2 + kFail;
        bVar3 = true;
      }
      this_00 = (HMpsFF *)local_108._0_8_;
      if ((HMpsFF *)local_108._0_8_ != (HMpsFF *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      log_options = local_80;
      if (bVar3) goto LAB_001f4707;
    }
  }
  highsLogUser(log_options,kError,"Anomalous exit when parsing BOUNDS section of MPS file\n");
  this->num_row =
       (HighsInt)
       ((ulong)((long)(this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
LAB_001f4701:
  unaff_R13D = kFail;
LAB_001f4707:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return unaff_R13D;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRows(const HighsLogOptions& log_options,
                                   std::istream& file) {
  std::string strline, word;
  bool hasobj = false;
  // Assign a default objective name
  objective_name = "Objective";

  assert(num_row == 0);
  assert(row_lower.size() == 0);
  assert(row_upper.size() == 0);
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    bool isobj = false;
    bool isFreeRow = false;

    size_t start = 0;
    size_t end = 0;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != HMpsFF::Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read ROWS    OK\n");
      if (!hasobj) {
        warning_issued_ = true;
        highsLogUser(log_options, HighsLogType::kWarning,
                     "No objective row found\n");
        rowname2idx.emplace("artificial_empty_objective", -1);
      };
      return key;
    }

    if (strline[start] == 'G') {
      row_lower.push_back(0.0);
      row_upper.push_back(kHighsInf);
      row_type.push_back(Boundtype::kGe);
    } else if (strline[start] == 'E') {
      row_lower.push_back(0.0);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kEq);
    } else if (strline[start] == 'L') {
      row_lower.push_back(-kHighsInf);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kLe);
    } else if (strline[start] == 'N') {
      if (!hasobj) {
        isobj = true;
        hasobj = true;
        cost_row_location = num_row;
      } else {
        isFreeRow = true;
      }
    } else {
      std::string unidentified = strline.substr(start);
      trim(unidentified);
      highsLogUser(log_options, HighsLogType::kError,
                   "Entry \"%s\" in ROWS section of MPS file is unidentified\n",
                   unidentified.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string rowname = first_word(strline, start + 1);
    size_t rowname_end = first_word_end(strline, start + 1);

    // Detect if file is in fixed format.
    if (!is_end(strline, rowname_end)) {
      std::string name = strline.substr(start + 1);
      name = trim(name);
      if (name.size() > 8)
        return HMpsFF::Parsekey::kFail;
      else
        return HMpsFF::Parsekey::kFixedFormat;
    }

    // Do not add to matrix if row is free.
    if (isFreeRow) {
      rowname2idx.emplace(rowname, -2);
      continue;
    }

    // so in rowname2idx -1 is the objective, -2 is all the free rows
    auto ret = rowname2idx.emplace(rowname, isobj ? (-1) : (num_row++));
    // ret is a pair consisting of an iterator to the inserted
    // element (or the already-existing element if no insertion
    // happened) and a bool denoting whether the insertion took place

    // Else is enough here because all free rows are ignored.
    if (!isobj)
      row_names.push_back(rowname);
    else
      objective_name = rowname;

    if (!ret.second) {
      // Duplicate row name
      if (!has_duplicate_row_name_) {
        // This is the first so record it
        has_duplicate_row_name_ = true;
        auto mit = rowname2idx.find(rowname);
        assert(mit != rowname2idx.end());
        duplicate_row_name_ = rowname;
        duplicate_row_name_index0_ = mit->second;
        duplicate_row_name_index1_ = num_row - 1;
      }
    }
  }

  // Hard to imagine how the following lines are executed
  highsLogUser(log_options, HighsLogType::kError,
               "Anomalous exit when parsing BOUNDS section of MPS file\n");
  assert(1 == 0);
  // Update num_row in case there is free rows. They won't be added to the
  // constraint matrix.
  num_row = row_lower.size();
  return HMpsFF::Parsekey::kFail;
}